

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Own<kj::Directory::Replacer<kj::File>,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskDirectory::replaceFile(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  Iface *pIVar1;
  char *pcVar2;
  size_t sVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  uint uVar6;
  undefined4 in_register_0000000c;
  Replacer<kj::File> *extraout_RDX;
  Replacer<kj::File> *extraout_RDX_00;
  Replacer<kj::File> *pRVar7;
  WriteMode in_R8D;
  size_t *this_00;
  Own<kj::Directory::Replacer<kj::File>,_std::nullptr_t> OVar8;
  PathPtr finalName;
  OwnFd newFd;
  int newFd_;
  String temp;
  OwnFd local_a4;
  OwnFd local_a0;
  int local_9c;
  Function<int_(kj::StringPtr)> local_98;
  String local_88;
  String local_68;
  uint local_44;
  PathPtr local_40;
  
  finalName.parts.size_ = CONCAT44(in_register_0000000c,mode);
  finalName.parts.ptr = (String *)path.parts.size_;
  this_00 = &((path.parts.ptr)->content).size_;
  uVar6 = 0x1ff;
  if ((in_R8D & EXECUTABLE) == 0) {
    uVar6 = 0x1b6;
  }
  local_44 = uVar6 & 0xffffffc0;
  if ((in_R8D & PRIVATE) == 0) {
    local_44 = uVar6;
  }
  local_40.parts.ptr = finalName.parts.ptr;
  local_40.parts.size_ = finalName.parts.size_;
  local_98.impl.ptr = (Iface *)operator_new(0x20);
  (local_98.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___007108c8;
  local_98.impl.ptr[1]._vptr_Iface = (_func_int **)&local_9c;
  local_98.impl.ptr[2]._vptr_Iface = (_func_int **)this_00;
  local_98.impl.ptr[3]._vptr_Iface = (_func_int **)&local_44;
  local_98.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::replaceFile(kj::PathPtr,kj::WriteMode)const::{lambda(kj::StringPtr)#1}>>
        ::instance;
  DiskHandle::createNamedTemporary(&local_88,(DiskHandle *)this_00,finalName,in_R8D,&local_98);
  pIVar1 = local_98.impl.ptr;
  if (local_98.impl.ptr != (Iface *)0x0) {
    local_98.impl.ptr = (Iface *)0x0;
    (**(local_98.impl.disposer)->_vptr_Disposer)
              (local_98.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  local_a4.fd = local_9c;
  local_a0.fd = -1;
  puVar4 = (undefined8 *)operator_new(0x10);
  *puVar4 = &PTR_getFd_0070f9f8;
  *(int *)(puVar4 + 1) = local_9c;
  local_a4.fd = -1;
  *puVar4 = &PTR_getFd_00710578;
  PathPtr::toString(&local_68,&local_40,false);
  puVar5 = (undefined8 *)operator_new(0x60);
  *(WriteMode *)(puVar5 + 1) = in_R8D;
  *puVar5 = &PTR_get_00710930;
  puVar5[2] = &kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskFile>::instance;
  puVar5[3] = puVar4;
  puVar5[4] = this_00;
  puVar5[5] = local_88.content.ptr;
  puVar5[6] = local_88.content.size_;
  puVar5[7] = local_88.content.disposer;
  local_88.content.ptr = (char *)0x0;
  local_88.content.size_ = 0;
  puVar5[8] = local_68.content.ptr;
  puVar5[9] = local_68.content.size_;
  puVar5[10] = local_68.content.disposer;
  local_68.content.ptr = (char *)0x0;
  local_68.content.size_ = 0;
  *(undefined1 *)(puVar5 + 0xb) = 0;
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
       (_func_int **)
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::File>>::instance
  ;
  *(undefined8 **)&this->super_DiskHandle = puVar5;
  OwnFd::~OwnFd(&local_a4);
  OwnFd::~OwnFd(&local_a0);
  sVar3 = local_88.content.size_;
  pcVar2 = local_88.content.ptr;
  pRVar7 = extraout_RDX;
  if (local_88.content.ptr != (char *)0x0) {
    local_88.content.ptr = (char *)0x0;
    local_88.content.size_ = 0;
    (**(local_88.content.disposer)->_vptr_ArrayDisposer)
              (local_88.content.disposer,pcVar2,1,sVar3,sVar3,0);
    pRVar7 = extraout_RDX_00;
  }
  OVar8.ptr = pRVar7;
  OVar8.disposer = (Disposer *)this;
  return OVar8;
}

Assistant:

Own<Replacer<File>> replaceFile(PathPtr path, WriteMode mode) const override {
    return DiskHandle::replaceFile(path, mode);
  }